

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void anon_unknown.dwarf_f297::Help(void)

{
  std::operator<<((ostream *)&std::cout,
                  "usage: spoa [options ...] <sequences>\n\n  # default output is stdout\n  <sequences>\n    input file in FASTA/FASTQ format (can be compressed with gzip)\n\n  options:\n    -m <int>\n      default: 5\n      score for matching bases\n    -n <int>\n      default: -4\n      score for mismatching bases\n    -g <int>\n      default: -8\n      gap opening penalty (must be non-positive)\n    -e <int>\n      default: -6\n      gap extension penalty (must be non-positive)\n    -q <int>\n      default: -10\n      gap opening penalty of the second affine function\n      (must be non-positive)\n    -c <int>\n      default: -4\n      gap extension penalty of the second affine function\n      (must be non-positive)\n    -l, --algorithm <int>\n      default: 0\n      alignment mode:\n        0 - local (Smith-Waterman)\n        1 - global (Needleman-Wunsch)\n        2 - semi-global\n    -r, --result <int> (option can be used multiple times)\n      default: 0\n      result mode:\n        0 - consensus (FASTA)\n        1 - multiple sequence alignment (FASTA)\n        2 - 0 & 1 (FASTA)\n        3 - partial order graph (GFA)\n        4 - 0 & 3 (GFA)\n    --min-coverage <int>\n      default: -1\n      minimal consensus coverage (usable only with -r 0)\n    -d, --dot <file>\n      output file for the partial order graph in DOT format\n    -s, --strand-ambiguous\n      for each sequence pick the strand with the better alignment\n    --version\n      prints the version number\n    -h, --help\n      prints the usage\n\n  gap mode:\n    linear if g >= e\n    affine if g <= q or e >= c\n    convex otherwise (default)\n"
                 );
  return;
}

Assistant:

void Help() {
  std::cout <<
      "usage: spoa [options ...] <sequences>\n"
      "\n"
      "  # default output is stdout\n"
      "  <sequences>\n"
      "    input file in FASTA/FASTQ format (can be compressed with gzip)\n"
      "\n"
      "  options:\n"
      "    -m <int>\n"
      "      default: 5\n"
      "      score for matching bases\n"
      "    -n <int>\n"
      "      default: -4\n"
      "      score for mismatching bases\n"
      "    -g <int>\n"
      "      default: -8\n"
      "      gap opening penalty (must be non-positive)\n"
      "    -e <int>\n"
      "      default: -6\n"
      "      gap extension penalty (must be non-positive)\n"
      "    -q <int>\n"
      "      default: -10\n"
      "      gap opening penalty of the second affine function\n"
      "      (must be non-positive)\n"
      "    -c <int>\n"
      "      default: -4\n"
      "      gap extension penalty of the second affine function\n"
      "      (must be non-positive)\n"
      "    -l, --algorithm <int>\n"
      "      default: 0\n"
      "      alignment mode:\n"
      "        0 - local (Smith-Waterman)\n"
      "        1 - global (Needleman-Wunsch)\n"
      "        2 - semi-global\n"
      "    -r, --result <int> (option can be used multiple times)\n"
      "      default: 0\n"
      "      result mode:\n"
      "        0 - consensus (FASTA)\n"
      "        1 - multiple sequence alignment (FASTA)\n"
      "        2 - 0 & 1 (FASTA)\n"
      "        3 - partial order graph (GFA)\n"
      "        4 - 0 & 3 (GFA)\n"
      "    --min-coverage <int>\n"
      "      default: -1\n"
      "      minimal consensus coverage (usable only with -r 0)\n"
      "    -d, --dot <file>\n"
      "      output file for the partial order graph in DOT format\n"
      "    -s, --strand-ambiguous\n"
      "      for each sequence pick the strand with the better alignment\n"
      "    --version\n"
      "      prints the version number\n"
      "    -h, --help\n"
      "      prints the usage\n"
      "\n"
      "  gap mode:\n"
      "    linear if g >= e\n"
      "    affine if g <= q or e >= c\n"
      "    convex otherwise (default)\n";
}